

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

SASL_MECHANISMS_HANDLE sasl_mechanisms_create(AMQP_VALUE sasl_server_mechanisms_value)

{
  int iVar1;
  SASL_MECHANISMS_INSTANCE_TAG SVar2;
  undefined4 local_24;
  int result;
  AMQP_VALUE sasl_server_mechanisms_amqp_value;
  SASL_MECHANISMS_INSTANCE *sasl_mechanisms_instance;
  AMQP_VALUE sasl_server_mechanisms_value_local;
  
  sasl_server_mechanisms_amqp_value = (AMQP_VALUE)malloc(8);
  if (sasl_server_mechanisms_amqp_value != (AMQP_VALUE)0x0) {
    SVar2.composite_value = amqpvalue_create_composite_with_ulong_descriptor(0x40);
    *(AMQP_VALUE *)sasl_server_mechanisms_amqp_value = SVar2.composite_value;
    if (*(AMQP_VALUE *)sasl_server_mechanisms_amqp_value == (AMQP_VALUE)0x0) {
      free(sasl_server_mechanisms_amqp_value);
      sasl_server_mechanisms_amqp_value = (AMQP_VALUE)0x0;
    }
    else {
      local_24 = 0;
      iVar1 = amqpvalue_set_composite_item
                        (*(AMQP_VALUE *)sasl_server_mechanisms_amqp_value,0,
                         sasl_server_mechanisms_value);
      if (iVar1 != 0) {
        local_24 = 0x27ab;
      }
      amqpvalue_destroy(sasl_server_mechanisms_value);
      if (local_24 != 0) {
        sasl_mechanisms_destroy((SASL_MECHANISMS_HANDLE)sasl_server_mechanisms_amqp_value);
        sasl_server_mechanisms_amqp_value = (AMQP_VALUE)0x0;
      }
    }
  }
  return (SASL_MECHANISMS_HANDLE)sasl_server_mechanisms_amqp_value;
}

Assistant:

SASL_MECHANISMS_HANDLE sasl_mechanisms_create(AMQP_VALUE sasl_server_mechanisms_value)
{
    SASL_MECHANISMS_INSTANCE* sasl_mechanisms_instance = (SASL_MECHANISMS_INSTANCE*)malloc(sizeof(SASL_MECHANISMS_INSTANCE));
    if (sasl_mechanisms_instance != NULL)
    {
        sasl_mechanisms_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(64);
        if (sasl_mechanisms_instance->composite_value == NULL)
        {
            free(sasl_mechanisms_instance);
            sasl_mechanisms_instance = NULL;
        }
        else
        {
            AMQP_VALUE sasl_server_mechanisms_amqp_value;
            int result = 0;

            sasl_server_mechanisms_amqp_value = sasl_server_mechanisms_value;
            if ((result == 0) && (amqpvalue_set_composite_item(sasl_mechanisms_instance->composite_value, 0, sasl_server_mechanisms_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(sasl_server_mechanisms_amqp_value);
            if (result != 0)
            {
                sasl_mechanisms_destroy(sasl_mechanisms_instance);
                sasl_mechanisms_instance = NULL;
            }
        }
    }

    return sasl_mechanisms_instance;
}